

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_connector_change_ref.c
# Opt level: O3

apx_portConnectorChangeRef_t *
apx_portConnectorChangeRef_new
          (apx_nodeInstance_t *nodeInstance,apx_portConnectorChangeTable_t *connector_changes)

{
  apx_portConnectorChangeRef_t *paVar1;
  
  paVar1 = (apx_portConnectorChangeRef_t *)malloc(0x18);
  if (paVar1 != (apx_portConnectorChangeRef_t *)0x0) {
    paVar1->is_connector_changes_weak_ref = false;
    paVar1->node_instance = nodeInstance;
    paVar1->connector_changes = connector_changes;
  }
  return paVar1;
}

Assistant:

apx_portConnectorChangeRef_t *apx_portConnectorChangeRef_new(apx_nodeInstance_t *nodeInstance, apx_portConnectorChangeTable_t *connector_changes)
{
   apx_portConnectorChangeRef_t *self = (apx_portConnectorChangeRef_t*) malloc(sizeof(apx_portConnectorChangeRef_t));
   if (self != NULL)
   {
      apx_portConnectorChangeRef_create(self, nodeInstance, connector_changes);
   }
   return self;
}